

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  uint uVar1;
  int iVar2;
  Fts3Table *p_00;
  long lVar3;
  char *zTerm;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  Fts3MultiSegReader *pFVar8;
  int iToken;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  Fts3PhraseToken *pFVar12;
  Fts3Table *pTab;
  int nThis;
  int local_6c;
  Fts3MultiSegReader *local_68;
  int local_5c;
  Fts3PhraseToken *local_58;
  char *local_50;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_48;
  long local_40;
  Fts3SegReader **local_38;
  
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  if (((bOptOk != 0) && (pCsr->bDesc == p_00->bDescIdx)) && (0xfffffffb < p->nToken - 5U)) {
    uVar1 = p->nToken;
    uVar5 = 0;
    uVar4 = uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    if (0 < (int)uVar1) {
      pFVar12 = p->aToken;
      lVar7 = 0;
      do {
        if ((*(int *)((long)&p->aToken[0].bFirst + lVar7) != 0) ||
           ((lVar3 = *(long *)((long)&p->aToken[0].pSegcsr + lVar7), lVar3 != 0 &&
            (uVar5 = 1, *(int *)(lVar3 + 0x30) == 0)))) goto LAB_001d43f8;
        lVar7 = lVar7 + 0x28;
      } while ((ulong)uVar4 * 0x28 != lVar7);
      if (uVar5 != 0) {
        local_5c = -1;
        if (p->iColumn < p_00->nColumn) {
          local_5c = p->iColumn;
        }
        iVar11 = 1;
        iVar2 = 1;
        if (p->nToken < 1) {
LAB_001d4474:
          iVar11 = iVar2;
          iVar6 = 0;
        }
        else {
          local_40 = 0;
          local_58 = pFVar12;
          do {
            local_68 = pFVar12[local_40].pSegcsr;
            if (local_68 != (Fts3MultiSegReader *)0x0) {
              zTerm = pFVar12[local_40].z;
              iVar2 = pFVar12[local_40].n;
              uVar1 = local_68->nSegment;
              local_48 = fts3SegReaderDoclistCmpRev;
              if (p_00->bDescIdx == '\0') {
                local_48 = fts3SegReaderDoclistCmp;
              }
              iVar6 = fts3SegReaderStart(p_00,local_68,zTerm,iVar2);
              if (iVar6 != 0) break;
              if ((int)uVar1 < 1) {
                local_68->nAdvance = 0;
                lVar7 = 0;
                pFVar8 = local_68;
              }
              else {
                local_38 = local_68->apSegment;
                uVar9 = 0;
                do {
                  uVar10 = uVar9;
                  if ((local_38[uVar9]->aNode == (char *)0x0) ||
                     (iVar6 = fts3SegReaderTermCmp(local_38[uVar9],zTerm,iVar2), iVar6 != 0)) break;
                  uVar9 = uVar9 + 1;
                  uVar10 = (ulong)uVar1;
                } while (uVar1 != uVar9);
                pFVar12 = local_58;
                pFVar8 = local_68;
                local_68->nAdvance = (int)uVar10;
                lVar7 = 0;
                if (0 < (int)uVar10) {
                  do {
                    iVar6 = fts3SegReaderFirstDocid
                                      ((Fts3Table *)(ulong)p_00->bDescIdx,pFVar8->apSegment[lVar7]);
                    if (iVar6 != 0) goto LAB_001d4476;
                    lVar7 = lVar7 + 1;
                  } while (lVar7 < pFVar8->nAdvance);
                }
              }
              fts3SegReaderSort(pFVar8->apSegment,(int)lVar7,(int)lVar7,local_48);
              pFVar8->iColFilter = local_5c;
            }
            local_40 = local_40 + 1;
            iVar6 = 0;
          } while (local_40 < p->nToken);
        }
        goto LAB_001d4476;
      }
    }
  }
LAB_001d43f8:
  pFVar12 = p->aToken;
  lVar7 = 0;
  iVar11 = 0;
  do {
    if (p->nToken <= lVar7) {
      iVar2 = 0;
      goto LAB_001d4474;
    }
    iVar6 = 0;
    if (pFVar12->pSegcsr != (Fts3MultiSegReader *)0x0) {
      local_6c = 0;
      local_50 = (char *)0x0;
      iVar6 = fts3TermSelect(p_00,pFVar12,p->iColumn,&local_6c,&local_50);
      if (iVar6 == 0) {
        iVar6 = fts3EvalPhraseMergeToken(p_00,p,(int)lVar7,local_50,local_6c);
      }
    }
    lVar7 = lVar7 + 1;
    pFVar12 = pFVar12 + 1;
  } while (iVar6 == 0);
LAB_001d4476:
  p->bIncr = iVar11;
  return iVar6;
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of 
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk 
   && pCsr->bDesc==pTab->bDescIdx 
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#ifdef SQLITE_TEST
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}